

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

fnet_socket_t fnet_socket_bind(fnet_sock_t sock_type,fnet_address_t *addr)

{
  fnet_socket_t __fd;
  int iVar1;
  fnet_socket_t fVar2;
  fnet_socket_t fVar3;
  
  fVar2 = 0xffffffff;
  fVar3 = fVar2;
  if (addr != (fnet_address_t *)0x0) {
    iVar1 = 1;
    if (sock_type != FNET_SOCK_STREAM) {
      iVar1 = (uint)(sock_type == FNET_SOCK_DGRAM) * 3 + -1;
    }
    __fd = socket((uint)addr->ss_family,iVar1,0);
    if ((__fd != 0xffffffff) &&
       ((iVar1 = bind(__fd,(sockaddr *)addr,0x80), iVar1 == -1 ||
        ((fVar3 = __fd, sock_type == FNET_SOCK_STREAM && (iVar1 = listen(__fd,10), iVar1 == -1))))))
    {
      close(__fd);
      fVar3 = fVar2;
    }
  }
  return fVar3;
}

Assistant:

fnet_socket_t fnet_socket_bind(fnet_sock_t sock_type, fnet_address_t const *addr)
{
    if (!addr)
    {
        FLOG_ERR("Invalid address");
        return FNET_INVALID_SOCKET;
    }

    int sock = socket(addr->ss_family, fnet_sock_type2posix(sock_type), 0);
    if (sock == -1)
    {
        FLOG_ERR("Unable to create new socket");
        return FNET_INVALID_SOCKET;
    }

    if (bind(sock, (const struct sockaddr*)addr, sizeof *addr) == -1)
    {
        FLOG_ERR("Socket bind error");
        close(sock);
        return FNET_INVALID_SOCKET;
    }

    if (sock_type == FNET_SOCK_STREAM
        && listen(sock, FMAX_ACCEPT_CONNECTIONS) == -1)
    {
        FLOG_ERR("Socket listen error");
        close(sock);
        return FNET_INVALID_SOCKET;
    }

    return (fnet_socket_t)sock;
}